

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac.c
# Opt level: O2

uint64_t pac_ns_until_purge(tsdn_t *tsdn,decay_t *decay,size_t npages)

{
  _Bool _Var1;
  uint64_t uVar2;
  
  _Var1 = malloc_mutex_trylock_final(&decay->mtx);
  if (_Var1) {
    uVar2 = 0;
  }
  else {
    mutex_owner_stats_update(tsdn,&decay->mtx);
    uVar2 = duckdb_je_decay_ns_until_purge(decay,npages,0x400);
    (decay->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(decay->mtx).field_0 + 0x48));
  }
  return uVar2;
}

Assistant:

static inline uint64_t
pac_ns_until_purge(tsdn_t *tsdn, decay_t *decay, size_t npages) {
	if (malloc_mutex_trylock(tsdn, &decay->mtx)) {
		/* Use minimal interval if decay is contended. */
		return BACKGROUND_THREAD_DEFERRED_MIN;
	}
	uint64_t result = decay_ns_until_purge(decay, npages,
	    ARENA_DEFERRED_PURGE_NPAGES_THRESHOLD);

	malloc_mutex_unlock(tsdn, &decay->mtx);
	return result;
}